

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio.c
# Opt level: O2

ssize_t archive_write_cpio_data(archive_write *a,void *buff,size_t s)

{
  ulong *puVar1;
  int iVar2;
  size_t length;
  
  puVar1 = (ulong *)a->format_data;
  length = *puVar1;
  if (s <= *puVar1) {
    length = s;
  }
  iVar2 = __archive_write_output(a,buff,length);
  *puVar1 = *puVar1 - length;
  if (iVar2 < 0) {
    length = (long)iVar2;
  }
  return length;
}

Assistant:

static ssize_t
archive_write_cpio_data(struct archive_write *a, const void *buff, size_t s)
{
	struct cpio *cpio;
	int ret;

	cpio = (struct cpio *)a->format_data;
	if (s > cpio->entry_bytes_remaining)
		s = (size_t)cpio->entry_bytes_remaining;

	ret = __archive_write_output(a, buff, s);
	cpio->entry_bytes_remaining -= s;
	if (ret >= 0)
		return (s);
	else
		return (ret);
}